

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteFoldedExprList(WatWriter *this,ExprList *exprs)

{
  WatWriter *expr;
  uint uVar1;
  Index result_count;
  Var *in_RAX;
  Func *pFVar2;
  Exception *pEVar3;
  Index IVar4;
  WatWriter *this_00;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  vStack_60;
  WatWriter *pWStack_48;
  undefined1 *puStack_40;
  Var *local_38;
  
  expr = (WatWriter *)exprs->first_;
  local_38 = in_RAX;
joined_r0x00f672e8:
  if (expr == (WatWriter *)0x0) {
    return;
  }
  switch(*(undefined4 *)
          &(expr->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
  case 0:
  case 0xf:
  case 0x15:
  case 0x1a:
  case 0x2b:
  case 0x2f:
    goto switchD_00f6730d_caseD_0;
  case 1:
  case 5:
  case 6:
  case 0xd:
  case 0x26:
switchD_00f6730d_caseD_1:
    IVar4 = 2;
    break;
  case 2:
  case 4:
  case 0x22:
  case 0x2c:
    IVar4 = 3;
    break;
  case 3:
  case 0x27:
    IVar4 = 2;
    goto LAB_00f67528;
  case 7:
  case 0x16:
  case 0x2e:
    result_count = (Index)((ulong)((long)expr->inline_import_map_[2].
                                         super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)expr->inline_import_map_[2].
                                        super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) >> 2);
    IVar4 = 0;
    goto LAB_00f6752a;
  case 8:
    puStack_40 = (undefined1 *)0xf674d9;
    IVar4 = GetLabelArity((WatWriter *)
                          (this->label_stack_).
                          super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (Var *)(this->label_stack_).
                                 super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
    break;
  case 9:
    puStack_40 = (undefined1 *)0xf674f4;
    result_count = GetLabelArity((WatWriter *)
                                 (this->label_stack_).
                                 super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 (Var *)(this->label_stack_).
                                        super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    IVar4 = result_count + 1;
    goto LAB_00f6752a;
  case 10:
    puStack_40 = (undefined1 *)0xf67512;
    IVar4 = GetLabelArity((WatWriter *)
                          (this->label_stack_).
                          super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (Var *)(this->label_stack_).
                                 super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
    IVar4 = IVar4 + 1;
    break;
  case 0xb:
  case 0x20:
    local_38 = (Var *)&(expr->label_stack_).
                       super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puStack_40 = (undefined1 *)0xf67399;
    pFVar2 = Module::GetFunc(this->module_,local_38);
    result_count = 0;
    IVar4 = 0;
    if (pFVar2 != (Func *)0x0) {
      IVar4 = (Index)((ulong)((long)(pFVar2->decl).sig.param_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pFVar2->decl).sig.param_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
    }
    puStack_40 = (undefined1 *)0xf673c0;
    pFVar2 = Module::GetFunc(this->module_,local_38);
    if (pFVar2 != (Func *)0x0) {
      result_count = (Index)((ulong)((long)(pFVar2->decl).sig.result_types.
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pFVar2->decl).sig.result_types.
                                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2);
    }
    goto LAB_00f6752a;
  case 0xc:
  case 0x21:
    IVar4 = (int)((ulong)((long)expr->inline_import_map_[0].
                                super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)expr->inline_import_map_[0].
                               super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
    result_count = (Index)((ulong)((long)expr->inline_import_map_[1].
                                         super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)expr->inline_import_map_[1].
                                        super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2);
    goto LAB_00f6752a;
  case 0xe:
  case 0x11:
  case 0x12:
  case 0x1c:
  case 0x30:
    IVar4 = 0;
    break;
  case 0x10:
  case 0x23:
  case 0x24:
    IVar4 = 1;
    goto LAB_00f67528;
  case 0x13:
  case 0x14:
    result_count = (Index)((ulong)((long)expr->inline_import_map_[2].
                                         super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)expr->inline_import_map_[2].
                                        super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) >> 2);
    IVar4 = 1;
    goto LAB_00f6752a;
  case 0x17:
  case 0x19:
  case 0x1b:
  case 0x28:
  case 0x29:
    IVar4 = 3;
    goto LAB_00f67528;
  case 0x18:
  case 0x1d:
  case 0x1e:
  case 0x2a:
    IVar4 = 0;
    goto LAB_00f67528;
  case 0x1f:
    IVar4 = (Index)((ulong)((long)(this->current_func_->decl).sig.result_types.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->current_func_->decl).sig.result_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 2);
    break;
  case 0x25:
    uVar1 = *(int *)((long)&(expr->label_stack_).
                            super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) - 0xd1;
    if (0x12 < uVar1) goto LAB_00f67553;
    if ((0x24933U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x49244U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_00f67553;
      goto switchD_00f6730d_caseD_1;
    }
    goto switchD_00f6730d_caseD_0;
  case 0x2d:
    puStack_40 = (undefined1 *)0xf674b5;
    pEVar3 = Module::GetExcept(this->module_,
                               (Var *)&(expr->label_stack_).
                                       super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pEVar3 == (Exception *)0x0) {
      IVar4 = 0;
    }
    else {
      IVar4 = (Index)((ulong)((long)(pEVar3->sig).
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pEVar3->sig).
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
    }
LAB_00f67528:
    result_count = 0;
    goto LAB_00f6752a;
  default:
    puStack_40 = (undefined1 *)0xf67553;
    _GLOBAL__N_1::WatWriter::WriteFoldedExprList((WatWriter *)expr);
LAB_00f67553:
    puStack_40 = (undefined1 *)0xf6755b;
    this_00 = expr;
    _GLOBAL__N_1::WatWriter::WriteFoldedExprList((WatWriter *)expr);
    vStack_60.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this_00->expr_tree_stack_).
         super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ._M_impl.super__Vector_impl_data._M_start;
    vStack_60.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this_00->expr_tree_stack_).
         super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    vStack_60.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this_00->expr_tree_stack_).
         super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this_00->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWStack_48 = expr;
    puStack_40 = &stack0xfffffffffffffff8;
    FlushExprTreeVector(this_00,&vStack_60);
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::~vector(&vStack_60);
    return;
  }
LAB_00f67480:
  result_count = 1;
LAB_00f6752a:
  puStack_40 = (undefined1 *)0xf6752f;
  PushExpr(this,(Expr *)expr,IVar4,result_count);
  expr = (WatWriter *)((intrusive_list_base<wabt::Expr> *)&expr->module_)->next_;
  goto joined_r0x00f672e8;
switchD_00f6730d_caseD_0:
  IVar4 = 1;
  goto LAB_00f67480;
}

Assistant:

void WatWriter::WriteFoldedExprList(const ExprList& exprs) {
  WABT_TRACE(WriteFoldedExprList);
  for (const Expr& expr : exprs) {
    WriteFoldedExpr(&expr);
  }
}